

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImRect *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiNavLayer IVar6;
  ImGuiID IVar7;
  uint uVar8;
  ImGuiWindow *pIVar9;
  ImGuiWindow *pIVar10;
  ImVec2 IVar11;
  ImVec2 IVar12;
  uint uVar13;
  ImGuiContext *pIVar14;
  bool bVar15;
  bool bVar16;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  ImGui *this;
  ImVec2 IVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar14 = GImGui;
  pIVar9 = GImGui->CurrentWindow;
  if (id == 0) goto LAB_001dc657;
  IVar6 = (pIVar9->DC).NavLayerCurrent;
  piVar1 = &(pIVar9->DC).NavLayerActiveMaskNext;
  *piVar1 = *piVar1 | 1 << ((byte)IVar6 & 0x1f);
  IVar7 = pIVar14->NavId;
  if ((((IVar7 != id) && (pIVar14->NavAnyRequest != true)) ||
      (pIVar10 = pIVar14->NavWindow, pIVar10->RootWindowForNav != pIVar9->RootWindowForNav)) ||
     ((pIVar9 != pIVar10 && (((uint)(pIVar10->Flags | pIVar9->Flags) >> 0x17 & 1) == 0))))
  goto LAB_001dc657;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar8 = (pIVar9->DC).ItemFlags;
  fVar23 = (pIVar9->Pos).x;
  fVar21 = (nav_bb_arg->Min).x - fVar23;
  fVar24 = (pIVar9->Pos).y;
  fVar22 = (nav_bb_arg->Min).y - fVar24;
  fVar23 = (nav_bb_arg->Max).x - fVar23;
  fVar24 = (nav_bb_arg->Max).y - fVar24;
  if ((pIVar14->NavInitRequest == true) && (pIVar14->NavLayer == IVar6)) {
    if ((uVar8 & 0x10) == 0) {
      pIVar14->NavInitResultId = id;
      IVar17.y = fVar22;
      IVar17.x = fVar21;
      IVar11.y = fVar24;
      IVar11.x = fVar23;
      (pIVar14->NavInitResultRectRel).Min = IVar17;
      (pIVar14->NavInitResultRectRel).Max = IVar11;
      pIVar14->NavInitRequest = false;
      pIVar14->NavAnyRequest = pIVar14->NavMoveRequest;
    }
    else if (pIVar14->NavInitResultId == 0) {
      pIVar14->NavInitResultId = id;
      IVar18.y = fVar22;
      IVar18.x = fVar21;
      IVar12.y = fVar24;
      IVar12.x = fVar23;
      (pIVar14->NavInitResultRectRel).Min = IVar18;
      (pIVar14->NavInitResultRectRel).Max = IVar12;
    }
  }
  uVar13 = uVar8;
  if (IVar7 == id) {
    if ((pIVar14->NavMoveRequestFlags & 0x10) != 0) {
      uVar13 = uVar8 & 0xc;
      goto joined_r0x001dc786;
    }
  }
  else {
joined_r0x001dc786:
    if ((uVar8 & 0xc) == 0) {
      result = (ImGuiNavMoveResult *)(ulong)uVar13;
      this = (ImGui *)&pIVar14->NavMoveResultOther;
      if (pIVar9 == pIVar10) {
        this = (ImGui *)&pIVar14->NavMoveResultLocal;
      }
      if ((pIVar14->NavMoveRequest == true) &&
         (bVar15 = NavScoreItem(this,result,*nav_bb_arg), bVar15)) {
        *(ImGuiWindow **)this = pIVar9;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (pIVar9->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x1c) = fVar21;
        *(float *)(this + 0x20) = fVar22;
        *(float *)(this + 0x24) = fVar23;
        *(float *)(this + 0x28) = fVar24;
      }
      if ((pIVar14->NavMoveRequestFlags & 0x20) != 0) {
        fVar3 = (nav_bb_arg->Min).y;
        fVar19 = (pIVar9->ClipRect).Max.y;
        if (fVar3 < fVar19) {
          fVar4 = (nav_bb_arg->Max).y;
          fVar5 = (pIVar9->ClipRect).Min.y;
          if (((fVar5 < fVar4) &&
              (fVar20 = (pIVar9->ClipRect).Max.x,
              (nav_bb_arg->Min).x <= fVar20 && fVar20 != (nav_bb_arg->Min).x)) &&
             (fVar20 = (nav_bb_arg->Max).x,
             (pIVar9->ClipRect).Min.x <= fVar20 && fVar20 != (pIVar9->ClipRect).Min.x)) {
            fVar20 = fVar19;
            if (fVar4 <= fVar19) {
              fVar20 = fVar4;
            }
            if (fVar3 <= fVar19) {
              fVar19 = fVar3;
            }
            if (((fVar4 - fVar3) * 0.7 <=
                 (float)(-(uint)(fVar4 < fVar5) & (uint)fVar5 |
                        ~-(uint)(fVar4 < fVar5) & (uint)fVar20) -
                 (float)(-(uint)(fVar3 < fVar5) & (uint)fVar5 |
                        ~-(uint)(fVar3 < fVar5) & (uint)fVar19)) &&
               (bVar15 = NavScoreItem((ImGui *)&pIVar14->NavMoveResultLocalVisibleSet,result,
                                      *nav_bb_arg), bVar15)) {
              (pIVar14->NavMoveResultLocalVisibleSet).Window = pIVar9;
              (pIVar14->NavMoveResultLocalVisibleSet).ID = id;
              (pIVar14->NavMoveResultLocalVisibleSet).FocusScopeId =
                   (pIVar9->DC).NavFocusScopeIdCurrent;
              (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar21;
              (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar22;
              (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar23;
              (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar24;
            }
          }
        }
      }
    }
  }
  if (pIVar14->NavId == id) {
    pIVar14->NavWindow = pIVar9;
    IVar6 = (pIVar9->DC).NavLayerCurrent;
    pIVar14->NavLayer = IVar6;
    pIVar14->NavFocusScopeId = (pIVar9->DC).NavFocusScopeIdCurrent;
    pIVar14->NavIdIsAlive = true;
    pIVar14->NavIdTabCounter = (pIVar9->DC).FocusCounterTabStop;
    pIVar2 = pIVar9->NavRectRel + IVar6;
    (pIVar2->Min).x = fVar21;
    (pIVar2->Min).y = fVar22;
    (pIVar2->Max).x = fVar23;
    (pIVar2->Max).y = fVar24;
  }
LAB_001dc657:
  (pIVar9->DC).LastItemId = id;
  IVar12 = bb->Max;
  (pIVar9->DC).LastItemRect.Min = bb->Min;
  (pIVar9->DC).LastItemRect.Max = IVar12;
  (pIVar9->DC).LastItemStatusFlags = 0;
  (pIVar14->NextItemData).Flags = 0;
  bVar15 = IsClippedEx(bb,id,false);
  if ((!bVar15) && (bVar16 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar16)) {
    (pIVar9->DC).LastItemStatusFlags = 1;
  }
  return !bVar15;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    // Equivalent to calling SetLastItemData()
    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}